

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_with_absolute_prefix_unittest.cc
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  CapturedStream *this;
  FILE *__stream;
  size_type __n;
  size_t sVar2;
  ostream *poVar3;
  undefined8 extraout_RAX;
  undefined8 *puVar4;
  ulong uVar5;
  pointer __old_p;
  bool bVar6;
  string early_stderr;
  vector<char,_std::allocator<char>_> content;
  allocator_type local_b9;
  CapturedStream *local_b8;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  LogMessage local_90;
  
  fLB::FLAGS_colorlogtostderr = 0;
  fLB::FLAGS_timestamp_in_logfile_name = 1;
  setbuf(_stderr,(char *)0x0);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
             DAT_00130998 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_b0);
  if (google::s_captured_streams._16_8_ == 0) {
    this = (CapturedStream *)operator_new(0x28);
    local_90.allocated_ = (LogMessageData *)&local_90.time_;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b0,local_b0 + local_a8);
    google::CapturedStream::CapturedStream(this,2,(string *)&local_90);
    if (local_90.allocated_ != (LogMessageData *)&local_90.time_) {
      free(local_90.allocated_);
    }
    uVar1 = google::s_captured_streams._16_8_;
    bVar6 = google::s_captured_streams._16_8_ != 0;
    google::s_captured_streams._16_8_ = this;
    if (bVar6) {
      std::default_delete<google::CapturedStream>::operator()
                ((default_delete<google::CapturedStream> *)(google::s_captured_streams + 0x10),
                 (CapturedStream *)uVar1);
    }
    if (local_b0 != local_a0) {
      free(local_b0);
    }
    uVar1 = google::s_captured_streams._16_8_;
    local_b8 = (CapturedStream *)google::s_captured_streams._16_8_;
    google::s_captured_streams._16_8_ = 0;
    if (uVar1 != 0) {
      google::CapturedStream::StopCapture((CapturedStream *)uVar1);
      __stream = fopen((local_b8->filename_)._M_dataplus._M_p,"r");
      fseek(__stream,0,2);
      __n = ftell(__stream);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_90,__n,&local_b9);
      uVar5 = 0;
      fseek(__stream,0,0);
      do {
        sVar2 = fread((void *)((long)(local_90.allocated_)->message_text_ + uVar5 + -4),1,
                      __n - uVar5,__stream);
        uVar5 = uVar5 + sVar2;
        if (sVar2 == 0) break;
      } while (uVar5 < __n);
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,local_90.allocated_,
                 (long)(local_90.allocated_)->message_text_ + uVar5 + -4);
      if (local_90.allocated_ != (LogMessageData *)0x0) {
        free(local_90.allocated_);
      }
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      if (local_b8 != (CapturedStream *)0x0) {
        std::default_delete<google::CapturedStream>::operator()
                  ((default_delete<google::CapturedStream> *)&local_b8,local_b8);
      }
      bVar6 = google::IsGoogleLoggingInitialized();
      if (bVar6) {
        main_cold_2();
      }
      else {
        google::InitGoogleLogging(*argv);
        bVar6 = google::IsGoogleLoggingInitialized();
        if (bVar6) {
          puVar4 = google::g_testlist;
          if (google::g_testlist != DAT_001309e8) {
            do {
              (*(code *)*puVar4)();
              puVar4 = puVar4 + 1;
            } while (puVar4 != DAT_001309e8);
          }
          fprintf(_stderr,"Passed %d tests\n\nPASS\n",
                  (ulong)((long)puVar4 - (long)google::g_testlist) >> 3 & 0xffffffff);
          if (local_b0 != local_a0) {
            free(local_b0);
          }
          return 0;
        }
      }
      main_cold_1();
      if (local_90.allocated_ != (LogMessageData *)0x0) {
        free(local_90.allocated_);
      }
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      if (local_b8 != (CapturedStream *)0x0) {
        std::default_delete<google::CapturedStream>::operator()
                  ((default_delete<google::CapturedStream> *)&local_b8,local_b8);
      }
      _Unwind_Resume(extraout_RAX);
    }
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x183);
    poVar3 = google::LogMessage::stream(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Check failed: cap ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,": did you forget CaptureTestStdout() or CaptureTestStderr()?",0x3c);
  }
  else {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15c);
    poVar3 = google::LogMessage::stream(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Check failed: s_captured_streams[fd] == nullptr ",0x30);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

int main(int argc, char** argv) {
  FLAGS_colorlogtostderr = false;
  FLAGS_timestamp_in_logfile_name = true;
#ifdef GLOG_USE_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif
  // Make sure stderr is not buffered as stderr seems to be buffered
  // on recent windows.
  setbuf(stderr, nullptr);

  // Test some basics before InitGoogleLogging:
  CaptureTestStderr();
  const string early_stderr = GetCapturedTestStderr();

  EXPECT_FALSE(IsGoogleLoggingInitialized());

  InitGoogleLogging(argv[0]);

  EXPECT_TRUE(IsGoogleLoggingInitialized());

  InitGoogleTest(&argc, argv);
#ifdef HAVE_LIB_GMOCK
  InitGoogleMock(&argc, argv);
#endif

  // so that death tests run before we use threads
  CHECK_EQ(RUN_ALL_TESTS(), 0);
}